

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ssl_setup_x509_store(Curl_cfilter *cf,Curl_easy *data,SSL_CTX *ssl_ctx)

{
  byte bVar1;
  curl_blob *pcVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  ssl_primary_config *psVar6;
  ssl_config_data *psVar7;
  undefined8 *puVar8;
  timediff_t tVar9;
  X509_STORE *pXVar10;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  char *pcVar11;
  BIO *bp;
  stack_st_X509_INFO *psVar12;
  void *pvVar13;
  curl_trc_feat *pcVar14;
  long lVar15;
  char *pcVar16;
  char *pcVar17;
  int iVar18;
  Curl_hash *h;
  curltime cVar19;
  curltime newer;
  byte local_7a;
  CURLcode local_6c;
  
  psVar6 = Curl_ssl_cf_get_primary_config(cf);
  psVar7 = Curl_ssl_cf_get_config(cf,data);
  local_7a = 1;
  if (((((data->set).general_ssl.ca_cache_timeout != 0) && ((psVar6->field_0x79 & 1) != 0)) &&
      (psVar6->CApath == (char *)0x0)) &&
     ((psVar6->ca_info_blob == (curl_blob *)0x0 && ((psVar7->primary).CRLfile == (char *)0x0)))) {
    local_7a = (psVar7->field_0xc0 & 0x40) >> 6;
  }
  if (((data->multi != (Curl_multi *)0x0) &&
      (puVar8 = (undefined8 *)Curl_hash_pick(&data->multi->proto_hash,"tls:ossl:x509:share",0x13),
      puVar8 != (undefined8 *)0x0)) && (puVar8[1] != 0)) {
    if (-1 < (data->set).general_ssl.ca_cache_timeout) {
      cVar19 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar19._0_12_,0);
      newer.tv_usec = SUB124(cVar19._0_12_,8);
      cVar19._12_4_ = 0;
      cVar19._0_12_ = *(undefined1 (*) [12])(puVar8 + 2);
      tVar9 = Curl_timediff(newer,cVar19);
      lVar15 = (long)(data->set).general_ssl.ca_cache_timeout;
      if (SBORROW8(tVar9,lVar15 * 1000) == tVar9 + lVar15 * -1000 < 0) goto LAB_00165e63;
    }
    psVar6 = Curl_ssl_cf_get_primary_config(cf);
    pcVar11 = psVar6->CAfile;
    if ((char *)*puVar8 == (char *)0x0) {
      if (pcVar11 == (char *)0x0) {
LAB_00165e34:
        pXVar10 = (X509_STORE *)puVar8[1];
        if ((pXVar10 != (X509_STORE *)0x0 && local_7a == 0) &&
           (iVar4 = X509_STORE_up_ref(pXVar10), iVar4 != 0)) {
          SSL_CTX_set_cert_store((SSL_CTX *)ssl_ctx,pXVar10);
          return CURLE_OK;
        }
      }
    }
    else if ((pcVar11 != (char *)0x0) && (iVar4 = strcmp((char *)*puVar8,pcVar11), iVar4 == 0))
    goto LAB_00165e34;
  }
LAB_00165e63:
  pXVar10 = SSL_CTX_get_cert_store((SSL_CTX *)ssl_ctx);
  psVar6 = Curl_ssl_cf_get_primary_config(cf);
  psVar7 = Curl_ssl_cf_get_config(cf,data);
  pcVar2 = psVar6->ca_info_blob;
  if (pcVar2 == (curl_blob *)0x0) {
    pcVar11 = psVar6->CAfile;
  }
  else {
    pcVar11 = (char *)0x0;
  }
  pcVar3 = psVar6->CApath;
  pcVar17 = (psVar7->primary).CRLfile;
  bVar1 = psVar6->field_0x79;
  if (((data->set).field_0x8cd & 0x10) != 0) {
    pcVar14 = (data->state).feat;
    if (pcVar14 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_00165ed6;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar14->log_level)) {
LAB_00165ed6:
      if (0 < cf->cft->log_level) {
        pcVar16 = "none";
        if (pcVar11 != (char *)0x0) {
          pcVar16 = pcVar11;
        }
        Curl_trc_cf_infof(data,cf,"populate_x509_store, path=%s, blob=%d",pcVar16,
                          (ulong)(pcVar2 != (curl_blob *)0x0));
      }
    }
  }
  if (pXVar10 == (X509_STORE *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((bVar1 & 1) == 0) goto LAB_00165f3b;
  if (pcVar2 != (curl_blob *)0x0) {
    local_6c = CURLE_SSL_CACERT_BADFILE;
    if (0x7fffffff < pcVar2->len) {
LAB_001662ab:
      Curl_failf(data,"error importing CA certificate blob");
      return local_6c;
    }
    bp = BIO_new_mem_buf(pcVar2->data,(int)pcVar2->len);
    if (bp == (BIO *)0x0) {
      local_6c = CURLE_OUT_OF_MEMORY;
      goto LAB_001662ab;
    }
    psVar12 = PEM_X509_INFO_read_bio(bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
    if (psVar12 == (stack_st_X509_INFO *)0x0) {
      BIO_free(bp);
      goto LAB_001662ab;
    }
    iVar4 = OPENSSL_sk_num(psVar12);
    local_6c = CURLE_SSL_CACERT_BADFILE;
    if (0 < iVar4) {
      iVar18 = 0;
      iVar4 = 0;
      do {
        puVar8 = (undefined8 *)OPENSSL_sk_value(psVar12,iVar4);
        if ((X509 *)*puVar8 != (X509 *)0x0) {
          iVar5 = X509_STORE_add_cert(pXVar10,(X509 *)*puVar8);
          if (iVar5 == 0) goto LAB_00166289;
          iVar18 = iVar18 + 1;
        }
        if ((X509_CRL *)puVar8[1] != (X509_CRL *)0x0) {
          iVar5 = X509_STORE_add_crl(pXVar10,(X509_CRL *)puVar8[1]);
          if (iVar5 == 0) goto LAB_00166289;
          iVar18 = iVar18 + 1;
        }
        iVar4 = iVar4 + 1;
        iVar5 = OPENSSL_sk_num(psVar12);
      } while (iVar4 < iVar5);
      local_6c = CURLE_SSL_CACERT_BADFILE;
      if (0 < iVar18) {
        local_6c = CURLE_OK;
      }
    }
LAB_00166289:
    OPENSSL_sk_pop_free(psVar12,X509_INFO_free);
    BIO_free(bp);
    if (local_6c != CURLE_OK) goto LAB_001662ab;
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar14 = (data->state).feat, pcVar14 == (curl_trc_feat *)0x0 || (0 < pcVar14->log_level)))
       ) {
      Curl_infof(data,"successfully imported CA certificate blob");
    }
  }
  if (pcVar11 == (char *)0x0 && pcVar3 == (char *)0x0) goto LAB_00165f3b;
  if ((pcVar11 != (char *)0x0) && (iVar4 = X509_STORE_load_file(pXVar10,pcVar11), iVar4 == 0)) {
    if (pcVar2 == (curl_blob *)0x0) {
      pcVar17 = "error setting certificate file: %s";
      goto LAB_001664bb;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar14 = (data->state).feat, pcVar14 == (curl_trc_feat *)0x0 || (0 < pcVar14->log_level)))
       ) {
      Curl_infof(data,"error setting certificate file, continuing anyway");
    }
  }
  if ((pcVar3 != (char *)0x0) && (iVar4 = X509_STORE_load_path(pXVar10,pcVar3), iVar4 == 0)) {
    if (pcVar2 == (curl_blob *)0x0) {
      pcVar17 = "error setting certificate path: %s";
      pcVar11 = pcVar3;
LAB_001664bb:
      Curl_failf(data,pcVar17,pcVar11);
      return CURLE_SSL_CACERT_BADFILE;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar14 = (data->state).feat, pcVar14 == (curl_trc_feat *)0x0 || (0 < pcVar14->log_level)))
       ) {
      Curl_infof(data,"error setting certificate path, continuing anyway");
    }
  }
  if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_00165f3b;
  pcVar14 = (data->state).feat;
  if ((pcVar14 == (curl_trc_feat *)0x0) || (0 < pcVar14->log_level)) {
    pcVar16 = "none";
    if (pcVar11 != (char *)0x0) {
      pcVar16 = pcVar11;
    }
    Curl_infof(data," CAfile: %s",pcVar16);
    if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_00165f3b;
    pcVar14 = (data->state).feat;
    if (pcVar14 != (curl_trc_feat *)0x0) goto LAB_001663d7;
  }
  else {
LAB_001663d7:
    if (pcVar14->log_level < 1) goto LAB_00165f3b;
  }
  pcVar11 = "none";
  if (pcVar3 != (char *)0x0) {
    pcVar11 = pcVar3;
  }
  Curl_infof(data," CApath: %s",pcVar11);
LAB_00165f3b:
  if (pcVar17 != (char *)0x0) {
    m = X509_LOOKUP_file();
    ctx = X509_STORE_add_lookup(pXVar10,m);
    if ((ctx == (X509_LOOKUP *)0x0) || (iVar4 = X509_load_crl_file(ctx,pcVar17,1), iVar4 == 0)) {
      Curl_failf(data,"error loading CRL file: %s",pcVar17);
      return CURLE_SSL_CRL_BADFILE;
    }
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar14 = (data->state).feat, pcVar14 == (curl_trc_feat *)0x0 || (0 < pcVar14->log_level)))
       ) {
      Curl_infof(data,"successfully loaded CRL file:");
    }
    X509_STORE_set_flags(pXVar10,0xc);
    if ((((data->set).field_0x8cd & 0x10) != 0) &&
       ((pcVar14 = (data->state).feat, pcVar14 == (curl_trc_feat *)0x0 || (0 < pcVar14->log_level)))
       ) {
      Curl_infof(data,"  CRLfile: %s",pcVar17);
    }
  }
  if ((((bVar1 & 1) != 0) && (X509_STORE_set_flags(pXVar10,0x8000), pcVar17 == (char *)0x0)) &&
     ((psVar7->field_0xc0 & 0x10) == 0)) {
    X509_STORE_set_flags(pXVar10,0x80000);
  }
  if (local_7a == 0) {
    psVar6 = Curl_ssl_cf_get_primary_config(cf);
    if (data->multi == (Curl_multi *)0x0) {
      return CURLE_OK;
    }
    h = &data->multi->proto_hash;
    puVar8 = (undefined8 *)Curl_hash_pick(h,"tls:ossl:x509:share",0x13);
    if (puVar8 == (undefined8 *)0x0) {
      puVar8 = (undefined8 *)(*Curl_ccalloc)(1,0x20);
      if (puVar8 == (undefined8 *)0x0) {
        return CURLE_OK;
      }
      pvVar13 = Curl_hash_add2(h,"tls:ossl:x509:share",0x13,puVar8,oss_x509_share_free);
      if (pvVar13 == (void *)0x0) {
        (*Curl_cfree)(puVar8);
        return CURLE_OK;
      }
    }
    iVar4 = X509_STORE_up_ref(pXVar10);
    if (iVar4 == 0) {
      return CURLE_OK;
    }
    if (psVar6->CAfile == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      pcVar11 = (*Curl_cstrdup)(psVar6->CAfile);
      if (pcVar11 == (char *)0x0) {
        X509_STORE_free(pXVar10);
        return CURLE_OK;
      }
    }
    if ((X509_STORE *)puVar8[1] != (X509_STORE *)0x0) {
      X509_STORE_free((X509_STORE *)puVar8[1]);
      (*Curl_cfree)((void *)*puVar8);
    }
    cVar19 = Curl_now();
    puVar8[2] = cVar19.tv_sec;
    *(int *)(puVar8 + 3) = cVar19.tv_usec;
    puVar8[1] = pXVar10;
    *puVar8 = pcVar11;
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_setup_x509_store(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   SSL_CTX *ssl_ctx)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  CURLcode result = CURLE_OK;
  X509_STORE *cached_store;
  bool cache_criteria_met;

  /* Consider the X509 store cacheable if it comes exclusively from a CAfile,
     or no source is provided and we are falling back to OpenSSL's built-in
     default. */
  cache_criteria_met = (data->set.general_ssl.ca_cache_timeout != 0) &&
    conn_config->verifypeer &&
    !conn_config->CApath &&
    !conn_config->ca_info_blob &&
    !ssl_config->primary.CRLfile &&
    !ssl_config->native_ca_store;

  cached_store = get_cached_x509_store(cf, data);
  if(cached_store && cache_criteria_met && X509_STORE_up_ref(cached_store)) {
    SSL_CTX_set_cert_store(ssl_ctx, cached_store);
  }
  else {
    X509_STORE *store = SSL_CTX_get_cert_store(ssl_ctx);

    result = populate_x509_store(cf, data, store);
    if(result == CURLE_OK && cache_criteria_met) {
      set_cached_x509_store(cf, data, store);
    }
  }

  return result;
}